

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(&ss.field_0x8,0x30);
  pp_Var1 = poVar2->_vptr_basic_ostream;
  *(undefined8 *)(&poVar2->field_0x10 + (long)pp_Var1[-3]) = 2;
  *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) & 0xffffffb5 | 8;
  *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}